

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_find(t_heap<xemmai::t_object> *this,void *a_p)

{
  iterator iVar1;
  void *pvVar2;
  key_type local_18;
  
  local_18 = (key_type)a_p;
  iVar1 = std::
          _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          ::lower_bound(&(this->v_blocks)._M_t,&local_18);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->v_blocks)._M_t._M_impl.super__Rb_tree_header) ||
     (pvVar2 = *(void **)(iVar1._M_node + 1), pvVar2 != a_p)) {
    if (iVar1._M_node == (this->v_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      return (t_object *)0x0;
    }
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar1._M_node);
    pvVar2 = *(void **)(iVar1._M_node + 1);
  }
  if (iVar1._M_node[1]._M_parent <= (_Base_ptr)((long)a_p - (long)pvVar2)) {
    return (t_object *)0x0;
  }
  if (((0x80L << (*(byte *)((long)pvVar2 + 0x30) & 0x3f)) - 1U & (ulong)((long)a_p - (long)pvVar2))
      == 0) {
    return (t_object *)a_p;
  }
  return (t_object *)0x0;
}

Assistant:

T* f_find(void* a_p)
	{
		auto i = v_blocks.lower_bound(static_cast<T*>(a_p));
		if (i == v_blocks.end() || i->first != a_p) {
			if (i == v_blocks.begin()) return nullptr;
			--i;
		}
		size_t j = static_cast<char*>(a_p) - reinterpret_cast<char*>(i->first);
		return j < i->second && (j & (c_UNIT << i->first->v_rank) - 1) == 0 ? static_cast<T*>(a_p) : nullptr;
	}